

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O2

RK_S32 vpu_api_decode(VpuCodecContext *ctx,VideoPacket_t *pkt,DecoderOut_t *aDecOut)

{
  RK_S32 RVar1;
  char *pcVar2;
  
  if (ctx == (VpuCodecContext *)0x0) {
    pcVar2 = "vpu_api_decode fail, input invalid";
  }
  else {
    if ((VpuApiLegacy *)ctx->vpuApiObj != (VpuApiLegacy *)0x0) {
      RVar1 = VpuApiLegacy::decode((VpuApiLegacy *)ctx->vpuApiObj,ctx,pkt,aDecOut);
      return RVar1;
    }
    pcVar2 = "vpu_api_decode fail, vpu api invalid";
  }
  _mpp_log_l(4,"vpu_api",pcVar2,0);
  return -1;
}

Assistant:

static RK_S32
vpu_api_decode(VpuCodecContext *ctx, VideoPacket_t *pkt, DecoderOut_t *aDecOut)
{
    if (ctx == NULL) {
        mpp_log("vpu_api_decode fail, input invalid");
        return VPU_API_ERR_UNKNOW;
    }

    VpuApiLegacy* api = (VpuApiLegacy*)(ctx->vpuApiObj);
    if (api == NULL) {
        mpp_log("vpu_api_decode fail, vpu api invalid");
        return VPU_API_ERR_UNKNOW;
    }

    return api->decode(ctx, pkt, aDecOut);
}